

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2gsf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  int *piVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  char **ppcVar12;
  size_t sStack_20e0;
  allocator local_20c9;
  char **local_20c8;
  ulong local_20c0;
  uint local_20b4;
  char *local_20b0;
  char *local_20a8;
  uint local_209c;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2098;
  char *endptr;
  long local_2060;
  key_type local_2058;
  char gsf_path [4096];
  char libname [4096];
  
  if (argc == 1) {
    pcVar9 = *argv;
LAB_00105c26:
    usage(pcVar9);
  }
  else {
    iVar11 = 1;
    endptr = (char *)0x0;
    local_20a8 = (char *)0x0;
    local_20c8 = argv;
    memset(gsf_path,0,0x1000);
    memset(libname,0,0x1000);
    bVar3 = true;
    local_20c0 = 0;
    local_20b0 = (char *)0x0;
    while ((iVar11 < argc && (pcVar9 = local_20c8[iVar11], *pcVar9 == '-'))) {
      iVar4 = strcmp(pcVar9,"--help");
      if (iVar4 == 0) {
        pcVar9 = *local_20c8;
        goto LAB_00105c26;
      }
      if ((pcVar9[1] != 'm') || (pcVar9[2] != '\0')) {
        if ((pcVar9[1] == 'o') && (pcVar9[2] == '\0')) {
          if (iVar11 + 1 < argc) {
            pcVar8 = local_20c8[iVar11 + 1];
            pcVar9 = gsf_path;
LAB_001059df:
            iVar11 = iVar11 + 1;
            strcpy(pcVar9,pcVar8);
            goto LAB_001059e4;
          }
        }
        else {
          iVar4 = strcmp(pcVar9,"--load");
          if (iVar4 == 0) {
            iVar11 = iVar11 + 1;
            if (iVar11 < argc) {
              local_20c0 = strtol(local_20c8[iVar11],&endptr,0x10);
              if (((*endptr != '\0') || (piVar5 = __errno_location(), *piVar5 == 0x22)) ||
                 ((long)local_20c0 < 0)) {
                pcVar9 = local_20c8[iVar11];
                pcVar8 = "Error: Number format error \"%s\"\n";
                goto LAB_00105cbf;
              }
              if (((uint)local_20c0 & 0xfffc0000) == 0x2000000 ||
                  ((uint)local_20c0 & 0xfe000000) == 0x8000000) {
                bVar3 = false;
                goto LAB_001059e4;
              }
              fprintf(_stderr,"Error: Load offset 0x%08X is out of range\n",local_20c0);
              pcVar9 = 
              "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n"
              ;
              sStack_20e0 = 0x5a;
              goto LAB_00105c68;
            }
          }
          else {
            iVar4 = strcmp(pcVar9,"--lib");
            if (iVar4 == 0) {
              if (iVar11 + 1 < argc) {
                pcVar8 = local_20c8[iVar11 + 1];
                pcVar9 = libname;
                goto LAB_001059df;
              }
            }
            else {
              iVar4 = strcmp(pcVar9,"--psfby");
              if ((iVar4 != 0) && (iVar4 = strcmp(pcVar9,"--gsfby"), iVar4 != 0)) {
                pcVar8 = "Error: Unknown option \"%s\"\n";
                goto LAB_00105cbf;
              }
              iVar11 = iVar11 + 1;
              if (iVar11 < argc) {
                local_20a8 = local_20c8[iVar11];
                goto LAB_001059e4;
              }
            }
          }
        }
        pcVar8 = "Error: Too few arguments for \"%s\"\n";
LAB_00105cbf:
        fprintf(_stderr,pcVar8,pcVar9);
        return 1;
      }
      local_20b0 = (char *)CONCAT71((int7)(CONCAT44(extraout_var,iVar4) >> 8),1);
LAB_001059e4:
      iVar11 = iVar11 + 1;
    }
    local_209c = 0x8000000;
    if (((ulong)local_20b0 & 1) != 0) {
      local_209c = 0x2000000;
    }
    local_20c0 = local_20c0 & 0xffffffff;
    if (bVar3) {
      local_20c0 = (ulong)local_209c;
    }
    if (argc == iVar11) {
      pcVar9 = "Error: No input files\n";
      sStack_20e0 = 0x16;
    }
    else {
      if ((argc - iVar11 < 2) || (gsf_path[0] == '\0')) {
        lVar10 = (long)iVar11;
        local_2060 = (long)argc;
        local_20b4 = 0;
        ppcVar12 = local_20c8;
        do {
          uVar1 = local_20b4;
          if (local_2060 <= lVar10) {
            if (local_20b4 != 0) {
              fprintf(_stderr,"%d error(s)\n",(ulong)local_20b4);
            }
            return (uint)(uVar1 != 0);
          }
          local_20b0 = ppcVar12[lVar10];
          if (gsf_path[0] == '\0') {
            strcpy(gsf_path,local_20b0);
            pcVar9 = path_findext(gsf_path);
            cVar2 = libname[0];
            if (pcVar9 != (char *)0x0) {
              *pcVar9 = '\0';
            }
            sVar6 = strlen(gsf_path);
            ppcVar12 = local_20c8;
            if (cVar2 != '\0') {
              builtin_strncpy(gsf_path + sVar6,".minigsf",9);
              goto LAB_00105b1c;
            }
            builtin_strncpy(gsf_path + sVar6,".gsf",5);
            local_2098._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2098._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2098._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2098._M_impl.super__Rb_tree_header._M_header;
            local_2098._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2098._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2098._M_impl.super__Rb_tree_header._M_header._M_left;
          }
          else {
            local_2098._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2098._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2098._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2098._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2098._M_impl.super__Rb_tree_header._M_header;
            local_2098._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2098._M_impl.super__Rb_tree_header._M_header._M_left;
            if (libname[0] != '\0') {
LAB_00105b1c:
              local_2098._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_2098._M_impl.super__Rb_tree_header._M_header;
              local_2098._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_2098._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_2098._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_2098._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_2098._M_impl.super__Rb_tree_header._M_header._M_left;
              std::__cxx11::string::string((string *)&local_2058,"_lib",&local_20c9);
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_2098,&local_2058);
              std::__cxx11::string::assign((char *)pmVar7);
              std::__cxx11::string::~string((string *)&local_2058);
            }
          }
          if ((local_20a8 != (char *)0x0) && (*local_20a8 != '\0')) {
            std::__cxx11::string::string((string *)&local_2058,"gsfby",&local_20c9);
            pmVar7 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_2098,&local_2058);
            std::__cxx11::string::assign((char *)pmVar7);
            std::__cxx11::string::~string((string *)&local_2058);
          }
          bVar3 = rom2gsf(local_20b0,gsf_path,local_209c,(uint32_t)local_20c0,
                          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_2098);
          local_20b4 = local_20b4 + !bVar3;
          puts(gsf_path);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_2098);
          lVar10 = lVar10 + 1;
        } while( true );
      }
      pcVar9 = "Error: Unable to specify output filename for multiple inputs\n";
      sStack_20e0 = 0x3d;
    }
LAB_00105c68:
    fwrite(pcVar9,sStack_20e0,1,_stderr);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	bool multiboot = false;
	uint32_t load_offset = 0;
	bool default_load_offset = true;
	char gsf_path[PATH_MAX] = { '\0' };
	char libname[PATH_MAX] = { '\0' };

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "-m") == 0) {
			multiboot = true;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(gsf_path, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--load") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			longval = strtol(argv[argi + 1], &endptr, 16);
			if (*endptr != '\0' || errno == ERANGE || longval < 0)
			{
				fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
				return EXIT_FAILURE;
			}
			load_offset = longval;
			default_load_offset = false;

			if (!((load_offset >= 0x8000000 && load_offset <= 0x9ffffff) || (load_offset >= 0x2000000 && load_offset <= 0x203ffff))) {
				fprintf(stderr, "Error: Load offset 0x%08X is out of range\n", load_offset);
				fprintf(stderr, "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n");
				return EXIT_FAILURE;
			}

			argi++;
		}
		else if (strcmp(argv[argi], "--lib") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(libname, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--gsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];

			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	uint32_t gsf_entrypoint = multiboot ? 0x02000000 : 0x08000000;
	if (default_load_offset) {
		load_offset = multiboot ? 0x02000000 : 0x08000000;
	}

	int argnum = argc - argi;
	if (argnum == 0) {
		fprintf(stderr, "Error: No input files\n");
		return EXIT_FAILURE;
	}
	if (argnum > 1 && strcmp(gsf_path, "") != 0) {
		fprintf(stderr, "Error: Unable to specify output filename for multiple inputs\n");
		return EXIT_FAILURE;
	}

	int num_error = 0;
	for (; argi < argc; argi++) {
		const char * rom_path = argv[argi];
		const char * rom_ext = path_findext(rom_path);

		if (strcmp(gsf_path, "") == 0) {
			strcpy(gsf_path, rom_path);
			path_stripext(gsf_path);
			if (strcmp(libname, "") != 0) {
				strcat(gsf_path, ".minigsf");
			}
			else {
				strcat(gsf_path, ".gsf");
			}
		}

		std::map<std::string, std::string> tags;
		if (strcmp(libname, "") != 0) {
			tags["_lib"] = libname;
		}

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["gsfby"] = psfby;
		}

		if (!rom2gsf(rom_path, gsf_path, gsf_entrypoint, load_offset, tags)) {
			num_error++;
		}

		puts(gsf_path);
	}

	if (num_error != 0) {
		fprintf(stderr, "%d error(s)\n", num_error);
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}